

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall TextField::TextField(TextField *this)

{
  undefined8 *in_RDI;
  Vector2f *size;
  UIComponent *in_stack_ffffffffffffffc0;
  RectangleShape *this_00;
  Text *this_01;
  Vector2<float> local_24;
  Vector2<float> local_1c [3];
  
  UIComponent::UIComponent(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__TextField_002bc210;
  in_RDI[1] = &PTR__TextField_002bc248;
  this_01 = (Text *)(in_RDI + 0x17);
  sf::Text::Text(this_01);
  this_00 = (RectangleShape *)(in_RDI + 0x45);
  sf::Text::Text(this_01);
  size = (Vector2f *)(in_RDI + 0x73);
  sf::Vector2<float>::Vector2(local_1c,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,size);
  sf::Vector2<float>::Vector2(&local_24,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,size);
  return;
}

Assistant:

TextField::TextField() {}